

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars,int nLevels)

{
  uint uVar1;
  Abc_TtHieMan_t *pAVar2;
  Vec_Mem_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  if (nLevels < 6) {
    pAVar2 = (Abc_TtHieMan_t *)calloc(1,0x78);
    pAVar2->nLastLevel = nLevels + -1;
    iVar9 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      iVar9 = 1;
    }
    pAVar2->nWords = iVar9;
    if (0 < nLevels) {
      uVar10 = 0;
      do {
        pVVar3 = (Vec_Mem_t *)calloc(1,0x30);
        pVVar3->nEntrySize = iVar9;
        pVVar3->LogPageSze = 0xc;
        pVVar3->PageMask = 0xfff;
        pVVar3->iPage = -1;
        pAVar2->vTtMem[uVar10] = pVVar3;
        uVar8 = 9999;
        while( true ) {
          do {
            uVar7 = uVar8;
            uVar8 = uVar7 + 1;
          } while ((uVar7 & 1) != 0);
          if (uVar8 < 9) break;
          iVar6 = 5;
          while (uVar8 % (iVar6 - 2U) != 0) {
            uVar1 = iVar6 * iVar6;
            iVar6 = iVar6 + 2;
            if (uVar8 < uVar1) goto LAB_00505b95;
          }
        }
LAB_00505b95:
        pVVar4 = (Vec_Int_t *)malloc(0x10);
        uVar1 = uVar8;
        if (uVar7 < 0xf) {
          uVar1 = 0x10;
        }
        pVVar4->nCap = uVar1;
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
        pVVar4->pArray = piVar5;
        pVVar4->nSize = uVar8;
        if (piVar5 != (int *)0x0) {
          memset(piVar5,0xff,(long)(int)uVar8 << 2);
        }
        pVVar3->vTable = pVVar4;
        pVVar4 = (Vec_Int_t *)malloc(0x10);
        pVVar4->nCap = 10000;
        pVVar4->nSize = 0;
        piVar5 = (int *)malloc(40000);
        pVVar4->pArray = piVar5;
        pVVar3->vNexts = pVVar4;
        pVVar4 = (Vec_Int_t *)malloc(0x10);
        pVVar4->nCap = 0x10;
        pVVar4->nSize = 0;
        piVar5 = (int *)malloc(0x40);
        pVVar4->pArray = piVar5;
        pAVar2->vRepres[uVar10] = pVVar4;
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)nLevels);
    }
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0x9c4;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(10000);
    pVVar4->pArray = piVar5;
    pAVar2->vPhase = pVVar4;
  }
  else {
    pAVar2 = (Abc_TtHieMan_t *)0x0;
  }
  return pAVar2;
}

Assistant:

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars, int nLevels)
{
    Abc_TtHieMan_t * p = NULL;
    int i;
    if (nLevels > TT_MAX_LEVELS) return p;
    p = ABC_CALLOC(Abc_TtHieMan_t, 1);
    p->nLastLevel = nLevels - 1;
    p->nWords = Abc_TtWordNum(nVars);
    for (i = 0; i < nLevels; i++)
    {
        p->vTtMem[i] = Vec_MemAlloc(p->nWords, 12);
        Vec_MemHashAlloc(p->vTtMem[i], 10000);
        p->vRepres[i] = Vec_IntAlloc(1);
    }
    p->vPhase = Vec_IntAlloc(2500);
    return p;
}